

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<long_*> * __thiscall
TPZVec<long_*>::operator=(TPZVec<long_*> *this,initializer_list<long_*> *list)

{
  size_type sVar1;
  iterator pplVar2;
  long **pplVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  sVar1 = list->_M_len;
  if (sVar1 != 0) {
    pplVar2 = list->_M_array;
    pplVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)pplVar3 + lVar4) = *(undefined8 *)((long)pplVar2 + lVar4);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}